

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectgenerator.cpp
# Opt level: O1

QString * __thiscall
ProjectGenerator::fixPathToQmake
          (QString *__return_storage_ptr__,ProjectGenerator *this,QString *file)

{
  Data *pDVar1;
  char cVar2;
  QStringView QVar3;
  QLatin1String QVar4;
  QLatin1String QVar5;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  pDVar1 = (file->d).d;
  (__return_storage_ptr__->d).d = pDVar1;
  (__return_storage_ptr__->d).ptr = (file->d).ptr;
  (__return_storage_ptr__->d).size = (file->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Option::dir_sep.d.size == 1) &&
     (QVar3.m_data = Option::dir_sep.d.ptr, QVar3.m_size = 1, QVar4.m_data = "/", QVar4.m_size = 1,
     cVar2 = QtPrivate::equalStrings(QVar3,QVar4), cVar2 != '\0')) {
    return __return_storage_ptr__;
  }
  QVar5.m_data = (char *)0x1;
  QVar5.m_size = (qsizetype)&Option::dir_sep;
  QString::replace((QString *)__return_storage_ptr__,QVar5,0x2a6ddb);
  return __return_storage_ptr__;
}

Assistant:

QString
ProjectGenerator::fixPathToQmake(const QString &file)
{
    QString ret = file;
    if(Option::dir_sep != QLatin1String("/"))
        ret.replace(Option::dir_sep, QLatin1String("/"));
    return ret;
}